

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread.c
# Opt level: O0

pint p_uthread_join(PUThread *thread)

{
  PUThreadBase *base_thread;
  PUThread *thread_local;
  
  if (thread == (PUThread *)0x0) {
    thread_local._4_4_ = -1;
  }
  else if ((thread->base).joinable == 0) {
    thread_local._4_4_ = -1;
  }
  else {
    p_uthread_wait_internal(thread);
    thread_local._4_4_ = (thread->base).ret_code;
  }
  return thread_local._4_4_;
}

Assistant:

P_LIB_API pint
p_uthread_join (PUThread *thread)
{
	const PUThreadBase *base_thread;

	if (P_UNLIKELY (thread == NULL))
		return -1;

	base_thread = (const PUThreadBase *) thread;

	if (base_thread->joinable == FALSE)
		return -1;

	p_uthread_wait_internal (thread);

	return base_thread->ret_code;
}